

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O1

void __thiscall
QThreadPool::startOnReservedThread(QThreadPool *this,function<void_()> functionToRun)

{
  code *pcVar1;
  QRunnable *runnable;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  _Any_data local_38;
  code *local_28;
  undefined8 local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (code *)in_RSI[2];
  if (pcVar1 == (code *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      releaseThread(this);
      return;
    }
  }
  else {
    local_20 = in_RSI[3];
    local_38._M_unused._0_8_ = (undefined8)*in_RSI;
    local_38._8_8_ = in_RSI[1];
    in_RSI[2] = 0;
    in_RSI[3] = 0;
    local_28 = pcVar1;
    runnable = QRunnable::create<std::function<void_()>,_true>((function<void_()> *)&local_38);
    startOnReservedThread(this,runnable);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::startOnReservedThread(std::function<void()> functionToRun)
{
    if (!functionToRun)
        return releaseThread();

    startOnReservedThread(QRunnable::create(std::move(functionToRun)));
}